

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

size_t __thiscall
Assimp::ObjFileParser::getTexCoordVector
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  char *pcVar1;
  pointer *ppaVar2;
  iterator __position;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  runtime_error *this_00;
  float fVar7;
  ai_real ret;
  float local_58;
  aiVector3t<float> local_50;
  undefined1 local_40 [16];
  
  sVar5 = getNumComponentsInDataDefinition(this);
  if (sVar5 == 3) {
    pcVar1 = this->m_buffer;
    copyNextWord(this,pcVar1,0x1000);
    local_50.x = 0.0;
    fast_atoreal_move<float>(pcVar1,&local_50.x,true);
    local_58 = local_50.x;
    copyNextWord(this,pcVar1,0x1000);
    local_50.x = 0.0;
    fast_atoreal_move<float>(pcVar1,&local_50.x,true);
    fVar7 = local_50.x;
    copyNextWord(this,pcVar1,0x1000);
    local_50._0_8_ = (ulong)(uint)local_50.y << 0x20;
    fast_atoreal_move<float>(pcVar1,&local_50.x,true);
    local_50.z = local_50.x;
  }
  else {
    if (sVar5 != 2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._0_8_ = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"OBJ: Invalid number of components","");
      std::runtime_error::runtime_error(this_00,(string *)&local_50);
      *(undefined ***)this_00 = &PTR__runtime_error_00875f28;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = this->m_buffer;
    copyNextWord(this,pcVar1,0x1000);
    local_50.x = 0.0;
    fast_atoreal_move<float>(pcVar1,&local_50.x,true);
    local_58 = local_50.x;
    copyNextWord(this,pcVar1,0x1000);
    local_50._0_8_ = (ulong)(uint)local_50.y << 0x20;
    fast_atoreal_move<float>(pcVar1,&local_50.x,true);
    local_50.z = 0.0;
    fVar7 = local_50.x;
  }
  if (0x7f7fffff < (uint)ABS(local_58)) {
    local_58 = 0.0;
  }
  if (0x7f7fffff < (uint)ABS(fVar7)) {
    fVar7 = 0.0;
  }
  if (0x7f7fffff < (uint)ABS(local_50.z)) {
    local_50.z = 0.0;
  }
  local_50.y = fVar7;
  local_50.x = local_58;
  __position._M_current =
       (point3d_array->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (point3d_array->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array,
               __position,&local_50);
  }
  else {
    (__position._M_current)->z = local_50.z;
    (__position._M_current)->x = local_58;
    (__position._M_current)->y = fVar7;
    ppaVar2 = &(point3d_array->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar2 = *ppaVar2 + 1;
  }
  pbVar6 = (byte *)(this->m_DataIt)._M_current;
  pbVar3 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar3 + -1 != pbVar6 && pbVar6 != pbVar3) {
    do {
      if (((*pbVar6 < 0xe) && ((0x3401U >> (*pbVar6 & 0x1f) & 1) != 0)) ||
         (pbVar6 = pbVar6 + 1, pbVar6 == pbVar3)) break;
    } while (pbVar6 != pbVar3 + -1);
  }
  pbVar4 = pbVar6;
  if (pbVar6 != pbVar3) {
    pbVar6 = pbVar6 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar4 = pbVar6;
  }
  for (; (pbVar4 != pbVar3 && ((*pbVar4 == 0x20 || (pbVar6 = pbVar4, *pbVar4 == 9))));
      pbVar4 = pbVar4 + 1) {
    pbVar6 = pbVar3;
  }
  (this->m_DataIt)._M_current = (char *)pbVar6;
  return sVar5;
}

Assistant:

size_t ObjFileParser::getTexCoordVector( std::vector<aiVector3D> &point3d_array ) {
    size_t numComponents = getNumComponentsInDataDefinition();
    ai_real x, y, z;
    if( 2 == numComponents ) {
        copyNextWord( m_buffer, Buffersize );
        x = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        y = ( ai_real ) fast_atof( m_buffer );
        z = 0.0;
    } else if( 3 == numComponents ) {
        copyNextWord( m_buffer, Buffersize );
        x = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        y = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        z = ( ai_real ) fast_atof( m_buffer );
    } else {
        throw DeadlyImportError( "OBJ: Invalid number of components" );
    }

    // Coerce nan and inf to 0 as is the OBJ default value
    if (!std::isfinite(x))
        x = 0;

    if (!std::isfinite(y))
        y = 0;

    if (!std::isfinite(z))
        z = 0;

    point3d_array.push_back( aiVector3D( x, y, z ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
    return numComponents;
}